

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.c
# Opt level: O0

apx_error_t
apx_program_decode_header(uint8_t *begin,uint8_t *end,uint8_t **next,apx_programHeader_t *header)

{
  uint32_t uVar1;
  uint8_t **ppuVar2;
  uint32_t tmp;
  uint32_t queued_elem_size;
  uint8_t queued_variant;
  uint8_t element_variant;
  _Bool flag;
  uint8_t variant;
  uint8_t opcode;
  _Bool is_queued_data;
  uint8_t **ppuStack_38;
  uint8_t data_variant;
  uint8_t *result;
  apx_programHeader_t *header_local;
  uint8_t **next_local;
  uint8_t *end_local;
  uint8_t *begin_local;
  
  if ((((begin == (uint8_t *)0x0) || (end == (uint8_t *)0x0)) || (end <= begin + 1)) ||
     ((next == (uint8_t **)0x0 || (header == (apx_programHeader_t *)0x0)))) {
    begin_local._4_4_ = 1;
  }
  else {
    ppuStack_38 = (uint8_t **)0x0;
    header->element_size = 0;
    header->queue_length = 0;
    queued_elem_size._3_1_ = *begin & 7;
    header->program_type = (*begin & 8) == 8;
    queued_elem_size._2_1_ = (*begin & 0x20) == 0x20;
    header->has_dynamic_data = (*begin & 0x10) == 0x10;
    *next = begin + 1;
    result = &header->program_type;
    header_local = (apx_programHeader_t *)next;
    next_local = (uint8_t **)end;
    end_local = begin;
    ppuStack_38 = (uint8_t **)
                  apx_vm_parse_uint32_by_variant
                            (*next,end,queued_elem_size._3_1_,&header->data_size);
    if ((*(uint8_t ***)header_local < ppuStack_38) && (ppuStack_38 <= next_local)) {
      *(uint8_t ***)header_local = ppuStack_38;
      if ((queued_elem_size._2_1_ & 1) != 0) {
        queued_elem_size._1_1_ = '\0';
        queued_elem_size._0_1_ = 0;
        tmp._3_1_ = 0;
        tmp._2_1_ = 0;
        tmp._1_1_ = 0;
        if (next_local <= *(uint8_t ***)header_local) {
          return 3;
        }
        apx_program_decode_instruction
                  (**(uint8_t **)header_local,(uint8_t *)((long)&queued_elem_size + 1),
                   (uint8_t *)&queued_elem_size,(_Bool *)((long)&tmp + 3));
        if (((queued_elem_size._1_1_ != '\x02') || ((byte)queued_elem_size < 3)) ||
           (0xb < (byte)queued_elem_size)) {
          return 3;
        }
        *(long *)header_local = *(long *)header_local + 1;
        if ((byte)queued_elem_size < 6) {
          tmp._2_1_ = '\0';
          tmp._1_1_ = (byte)queued_elem_size - 3;
        }
        else if ((byte)queued_elem_size < 9) {
          tmp._2_1_ = '\x01';
          tmp._1_1_ = (byte)queued_elem_size - 6;
        }
        else {
          tmp._2_1_ = '\x02';
          tmp._1_1_ = (byte)queued_elem_size - 9;
        }
        uVar1 = apx_vm_variant_to_size(tmp._1_1_);
        if ((uVar1 == 0) || (*(uint *)(result + 4) < uVar1)) {
          return 3;
        }
        ppuVar2 = (uint8_t **)
                  apx_vm_parse_uint32_by_variant
                            (*(uint8_t **)header_local,(uint8_t *)next_local,tmp._2_1_,
                             (uint32_t *)(result + 8));
        if ((ppuVar2 <= *(uint8_t ***)header_local) || (next_local < ppuVar2)) {
          return 3;
        }
        *(uint8_t ***)header_local = ppuVar2;
        if (*(int *)(result + 8) == 0) {
          return 3;
        }
        if ((*(int *)(result + 4) - uVar1) % *(uint *)(result + 8) != 0) {
          return 0x41;
        }
        *(uint *)(result + 0xc) = (*(int *)(result + 4) - uVar1) / *(uint *)(result + 8);
      }
      begin_local._4_4_ = 0;
    }
    else {
      begin_local._4_4_ = 3;
    }
  }
  return begin_local._4_4_;
}

Assistant:

apx_error_t apx_program_decode_header(uint8_t const* begin, uint8_t const* end, uint8_t const** next, apx_programHeader_t* header)
{
   if ((begin != NULL) && (end != NULL) && ((begin + UINT8_SIZE) < end) && (next != NULL) && (header != NULL))
   {
      uint8_t const* result = NULL;
      header->element_size = 0u;
      header->queue_length = 0u;
      uint8_t data_variant = begin[0] & APX_VM_HEADER_DATA_VARIANT_MASK;
      header->program_type = ((begin[0] & APX_VM_HEADER_PROG_TYPE_PACK) == APX_VM_HEADER_PROG_TYPE_PACK) ? APX_PACK_PROGRAM : APX_UNPACK_PROGRAM;
      bool const is_queued_data = ((begin[0] & APX_VM_HEADER_FLAG_QUEUED_DATA) == APX_VM_HEADER_FLAG_QUEUED_DATA);
      header->has_dynamic_data = ((begin[0] & APX_VM_HEADER_FLAG_DYNAMIC_DATA) == APX_VM_HEADER_FLAG_DYNAMIC_DATA);
      *next = begin+1;
      result = apx_vm_parse_uint32_by_variant(*next, end, data_variant, &header->data_size);
      if ((result > *next) && (result <= end))
      {
         *next = result;
      }
      else
      {
         return APX_PARSE_ERROR;
      }

      if (is_queued_data)
      {
         uint8_t opcode = 0u;
         uint8_t variant = 0u;
         bool flag = false;;
         uint8_t element_variant = 0u;
         uint8_t queued_variant = 0u;
         uint32_t queued_elem_size = 0u;
         uint32_t tmp = 0u;
         if (*next >= end)
         {
            return APX_PARSE_ERROR;
         }
         apx_program_decode_instruction(**next, &opcode, &variant, &flag);
         if ((opcode != APX_VM_OPCODE_DATA_SIZE) || (variant < APX_VM_VARIANT_ELEMENT_SIZE_U8_BASE) || (variant > APX_VM_VARIANT_ELEMENT_SIZE_LAST))
         {
            return APX_PARSE_ERROR;
         }
         (*next)++;
         if (variant < APX_VM_VARIANT_ELEMENT_SIZE_U16_BASE) //variant is between 3..5
         {
            element_variant = APX_VM_VARIANT_UINT8;
            queued_variant = variant - APX_VM_VARIANT_ELEMENT_SIZE_U8_BASE;
         }
         else if (variant < APX_VM_VARIANT_ELEMENT_SIZE_U32_BASE) //variant is between 6..8
         {
            element_variant = APX_VM_VARIANT_UINT16;
            queued_variant = variant - APX_VM_VARIANT_ELEMENT_SIZE_U16_BASE;
         }
         else //variant is between 9..11
         {
            element_variant = APX_VM_VARIANT_UINT32;
            queued_variant = variant - APX_VM_VARIANT_ELEMENT_SIZE_U32_BASE;
         }
         queued_elem_size = (uint32_t)apx_vm_variant_to_size(queued_variant);
         if ((queued_elem_size == 0u) || (queued_elem_size > header->data_size))
         {
            return APX_PARSE_ERROR;
         }
         result = apx_vm_parse_uint32_by_variant(*next, end, element_variant, &header->element_size);
         if ((result > *next) && (result <= end))
         {
            *next = result;
         }
         else
         {
            return APX_PARSE_ERROR;
         }
         //Calculate element size by subtracting queued_elem_size from header->data_size then dividing by header->element_size
         if (header->element_size == 0)
         {
            return APX_PARSE_ERROR;
         }
         tmp = header->data_size - queued_elem_size;
         if (tmp % header->element_size != 0)
         {
            return APX_INVALID_HEADER_ERROR;
         }
         header->queue_length = tmp / header->element_size;
      }
      return APX_NO_ERROR;
   }
   return APX_INVALID_ARGUMENT_ERROR;

}